

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconintra.c
# Opt level: O0

int has_top_right(BLOCK_SIZE sb_size,BLOCK_SIZE bsize,int mi_row,int mi_col,int top_available,
                 int right_available,PARTITION_TYPE partition,TX_SIZE txsz,int row_off,int col_off,
                 int ss_x,int ss_y)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint8_t *puVar4;
  byte bVar5;
  uint in_ECX;
  uint in_EDX;
  BLOCK_SIZE in_SIL;
  byte in_DIL;
  int in_R8D;
  int in_R9D;
  PARTITION_TYPE in_stack_00000008;
  uint8_t *has_tr_table;
  int in_stack_00000018;
  int idx2;
  int idx1;
  int this_blk_index;
  int blk_col_in_sb;
  int blk_row_in_sb;
  int sb_mi_size;
  int bh_in_mi_log2;
  int bw_in_mi_log2;
  int col_off_64;
  int plane_bw_unit_64;
  int top_right_count_unit;
  int plane_bw_unit;
  int bw_unit;
  int local_5c;
  uint local_4;
  
  if ((in_R8D == 0) || (in_R9D == 0)) {
    local_4 = 0;
  }
  else {
    bVar5 = (byte)blk_col_in_sb;
    if ((int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                   [in_SIL] >> (bVar5 & 0x1f) < 2) {
      local_5c = 1;
    }
    else {
      local_5c = (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                            [in_SIL] >> (bVar5 & 0x1f);
    }
    iVar3 = tx_size_wide_unit[(byte)has_tr_table];
    if (in_stack_00000018 < 1) {
      if (idx1 + iVar3 < local_5c) {
        local_4 = 1;
      }
      else {
        bVar5 = ""[in_SIL];
        uVar2 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                      [in_DIL];
        iVar3 = (int)(in_EDX & uVar2 - 1) >> (""[in_SIL] & 0x1f);
        iVar1 = (int)(in_ECX & uVar2 - 1) >> (bVar5 & 0x1f);
        if (iVar3 == 0) {
          local_4 = 1;
        }
        else if (iVar1 + 1 << (bVar5 & 0x1f) < (int)uVar2) {
          iVar1 = (iVar3 << (5 - bVar5 & 0x1f)) + iVar1;
          puVar4 = get_has_tr_table(in_stack_00000008,in_SIL);
          local_4 = (int)(uint)puVar4[iVar1 / 8] >> ((byte)(iVar1 % 8) & 0x1f) & 1;
        }
        else {
          local_4 = 0;
        }
      }
    }
    else if (block_size_wide[in_SIL] < 0x41) {
      local_4 = (uint)(idx1 + iVar3 < local_5c);
    }
    else if ((in_stack_00000018 == 0x10 >> ((byte)sb_mi_size & 0x1f)) &&
            (idx1 + iVar3 == 0x10 >> (bVar5 & 0x1f))) {
      local_4 = 1;
    }
    else {
      iVar1 = 0x10 >> (bVar5 & 0x1f);
      local_4 = (uint)(idx1 % iVar1 + iVar3 < iVar1);
    }
  }
  return local_4;
}

Assistant:

static int has_top_right(BLOCK_SIZE sb_size, BLOCK_SIZE bsize, int mi_row,
                         int mi_col, int top_available, int right_available,
                         PARTITION_TYPE partition, TX_SIZE txsz, int row_off,
                         int col_off, int ss_x, int ss_y) {
  if (!top_available || !right_available) return 0;

  const int bw_unit = mi_size_wide[bsize];
  const int plane_bw_unit = AOMMAX(bw_unit >> ss_x, 1);
  const int top_right_count_unit = tx_size_wide_unit[txsz];

  if (row_off > 0) {  // Just need to check if enough pixels on the right.
    if (block_size_wide[bsize] > block_size_wide[BLOCK_64X64]) {
      // Special case: For 128x128 blocks, the transform unit whose
      // top-right corner is at the center of the block does in fact have
      // pixels available at its top-right corner.
      if (row_off == mi_size_high[BLOCK_64X64] >> ss_y &&
          col_off + top_right_count_unit == mi_size_wide[BLOCK_64X64] >> ss_x) {
        return 1;
      }
      const int plane_bw_unit_64 = mi_size_wide[BLOCK_64X64] >> ss_x;
      const int col_off_64 = col_off % plane_bw_unit_64;
      return col_off_64 + top_right_count_unit < plane_bw_unit_64;
    }
    return col_off + top_right_count_unit < plane_bw_unit;
  } else {
    // All top-right pixels are in the block above, which is already available.
    if (col_off + top_right_count_unit < plane_bw_unit) return 1;

    const int bw_in_mi_log2 = mi_size_wide_log2[bsize];
    const int bh_in_mi_log2 = mi_size_high_log2[bsize];
    const int sb_mi_size = mi_size_high[sb_size];
    const int blk_row_in_sb = (mi_row & (sb_mi_size - 1)) >> bh_in_mi_log2;
    const int blk_col_in_sb = (mi_col & (sb_mi_size - 1)) >> bw_in_mi_log2;

    // Top row of superblock: so top-right pixels are in the top and/or
    // top-right superblocks, both of which are already available.
    if (blk_row_in_sb == 0) return 1;

    // Rightmost column of superblock (and not the top row): so top-right pixels
    // fall in the right superblock, which is not available yet.
    if (((blk_col_in_sb + 1) << bw_in_mi_log2) >= sb_mi_size) {
      return 0;
    }

    // General case (neither top row nor rightmost column): check if the
    // top-right block is coded before the current block.
    const int this_blk_index =
        ((blk_row_in_sb + 0) << (MAX_MIB_SIZE_LOG2 - bw_in_mi_log2)) +
        blk_col_in_sb + 0;
    const int idx1 = this_blk_index / 8;
    const int idx2 = this_blk_index % 8;
    const uint8_t *has_tr_table = get_has_tr_table(partition, bsize);
    return (has_tr_table[idx1] >> idx2) & 1;
  }
}